

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O3

string * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SimplePFor<FastPForLib::Simple8b<true>>,FastPForLib::VariableByte>::
name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined2 local_28;
  undefined1 local_26;
  
  local_30 = 0x4650656c706d6953;
  local_28 = 0x726f;
  local_38 = 10;
  local_26 = 0;
  local_40 = &local_30;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_70 = *puVar5;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar5;
    local_80 = (ulong *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_50 = 0x656c626169726156;
  local_48 = 0x65747942;
  local_58 = 0xc;
  local_44 = 0;
  uVar6 = 0xf;
  if (local_80 != &local_70) {
    uVar6 = local_70;
  }
  local_60 = &local_50;
  if ((local_78 + 0xcU < 0x10) && (uVar6 < local_78 + 0xcU)) {
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
  }
  else {
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)&local_50);
  }
  psVar1 = puVar4 + 2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return codec1.name() + "+" + codec2.name();
  }